

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyBuildTLASAttribs(BuildTLASAttribs *Attribs,RayTracingProperties *RTProps)

{
  long lVar1;
  Uint64 UVar2;
  RAYTRACING_BUILD_AS_FLAGS RVar3;
  int iVar4;
  BIND_FLAGS BVar5;
  Char *pCVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TLASBuildInstanceData *pTVar8;
  int extraout_var_01;
  long lVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char (*in_RCX) [97];
  char (*Args_1) [80];
  char (*Args_1_00) [60];
  char (*Args_1_01) [121];
  ulong extraout_RDX;
  char *in_R9;
  char (*in_stack_fffffffffffffb80) [50];
  undefined1 local_3b0 [8];
  string msg_23;
  string msg_22;
  undefined1 local_360 [8];
  string msg_21;
  undefined1 local_330 [8];
  string msg_20;
  string msg_19;
  BufferDesc *ScratchDesc;
  string msg_18;
  string msg_17;
  undefined1 local_2a0 [8];
  string msg_16;
  string msg_15;
  string msg_14;
  string msg_13;
  string msg_12;
  TLASInstanceDesc IDesc;
  string msg_11;
  string msg_10;
  string msg_9;
  string msg_8;
  TLASBuildInstanceData *Inst;
  uint local_160;
  Uint32 BitMask;
  Uint32 i;
  Uint32 AutoOffsetCounter;
  size_t InstDataSize;
  BufferDesc *InstDesc;
  string msg_7;
  undefined4 local_114;
  undefined1 local_110 [4];
  Uint32 PrevInstanceCount;
  string msg_6;
  string msg_5;
  TopLevelASDesc *TLASDesc;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  RayTracingProperties *RTProps_local;
  BuildTLASAttribs *Attribs_local;
  char (*pacVar7) [80];
  undefined4 extraout_var_02;
  
  msg.field_2._8_8_ = RTProps;
  if (Attribs->pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[33],char[24]>
              ((string *)local_38,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pTLAS must not be null.",(char (*) [24])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [97])0x32b;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32b);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (Attribs->pScratchBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[33]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer must not be null.",(char (*) [33])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [97])0x32c;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32c);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (Attribs->pInstances == (TLASBuildInstanceData *)0x0) {
    FormatString<char[33],char[29]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstances must not be null.",(char (*) [29])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [97])0x32d;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32d);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (Attribs->pInstanceBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[34]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer must not be null.",(char (*) [34])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [97])0x32e;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32e);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) && (Attribs->HitGroupStride == 0)) {
    FormatString<char[33],char[97]>
              ((string *)&TLASDesc,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
               ,in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x331);
    std::__cxx11::string::~string((string *)&TLASDesc);
  }
  iVar4 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  pacVar7 = (char (*) [80])CONCAT44(extraout_var,iVar4);
  Args_1 = pacVar7;
  if (*(uint *)(*pacVar7 + 8) < Attribs->InstanceCount) {
    in_R9 = *pacVar7 + 8;
    FormatString<char[33],char[16],unsigned_int,char[68],unsigned_int,char[3]>
              ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])0xf4dc4d,(char (*) [16])&Attribs->InstanceCount,
               (uint *)") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
               (char (*) [68])in_R9,(uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffffb80);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [80])0x337;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x337);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  if ((Attribs->Update & 1U) != 0) {
    RVar3 = operator&((*pacVar7)[0xc],RAYTRACING_BUILD_AS_ALLOW_UPDATE);
    if (RVar3 != RAYTRACING_BUILD_AS_ALLOW_UPDATE) {
      FormatString<char[33],char[80]>
                ((string *)local_110,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])
                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.",
                 Args_1);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x33c);
      std::__cxx11::string::~string((string *)local_110);
    }
    (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[9])
              ((undefined1 *)((long)&msg_7.field_2 + 8));
    local_114 = msg_7.field_2._8_4_;
    if (msg_7.field_2._8_4_ != Attribs->InstanceCount) {
      in_R9 = (char *)&local_114;
      FormatString<char[33],char[36],unsigned_int,char[38],unsigned_int,char[3]>
                ((string *)&InstDesc,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])"Update is true, but InstanceCount (",
                 (char (*) [36])&Attribs->InstanceCount,
                 (uint *)") does not match the previous value (",(char (*) [38])in_R9,
                 (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffffb80);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x340);
      std::__cxx11::string::~string((string *)&InstDesc);
    }
  }
  iVar4 = (*(Attribs->pInstanceBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  InstDataSize = CONCAT44(extraout_var_00,iVar4);
  _i = (ulong)Attribs->InstanceCount << 6;
  BitMask = 0;
  for (local_160 = 0; local_160 < Attribs->InstanceCount; local_160 = local_160 + 1) {
    pTVar8 = Attribs->pInstances + local_160;
    if ((pTVar8->CustomId & 0xff000000) != 0) {
      FormatString<char[33]>
                ((string *)((long)&msg_9.field_2 + 8),
                 (char (*) [33])"Only the lower 24 bits are used.");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x34d);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
    if ((pTVar8->ContributionToHitGroupIndex != 0xffffffff) &&
       ((pTVar8->ContributionToHitGroupIndex & 0xff000000) != 0)) {
      FormatString<char[33]>
                ((string *)((long)&msg_10.field_2 + 8),
                 (char (*) [33])"Only the lower 24 bits are used.");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x351);
      std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
    }
    if (pTVar8->InstanceName == (Char *)0x0) {
      FormatString<char[33],char[12],unsigned_int,char[33]>
                ((string *)((long)&msg_11.field_2 + 8),
                 (Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0xf4dccd,
                 (char (*) [12])&local_160,(uint *)"].InstanceName must not be null.",
                 (char (*) [33])in_R9);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x353);
      std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
    }
    if (pTVar8->pBLAS == (IBottomLevelAS *)0x0) {
      FormatString<char[33],char[12],unsigned_int,char[26]>
                ((string *)&IDesc.pBLAS,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])0xf4dccd,(char (*) [12])&local_160,
                 (uint *)"].pBLAS must not be null.",(char (*) [26])in_R9);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x354);
      std::__cxx11::string::~string((string *)&IDesc.pBLAS);
    }
    if (((Attribs->Update & 1U) != 0) &&
       ((*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[8])
                  (Attribs->pTLAS,pTVar8->InstanceName), extraout_var_01 == -1)) {
      FormatString<char[33],char[32],unsigned_int,char[32]>
                ((string *)((long)&msg_13.field_2 + 8),
                 (Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])"Update is true, but pInstances[",(char (*) [32])&local_160,
                 (uint *)"].InstanceName does not exists.",(char (*) [32])in_R9);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x359);
      std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
    }
    if (pTVar8->ContributionToHitGroupIndex == 0xffffffff) {
      BitMask = BitMask + 1;
    }
    if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) &&
       (pTVar8->ContributionToHitGroupIndex != 0xffffffff)) {
      FormatString<char[33],char[12],unsigned_int,char[123]>
                ((string *)((long)&msg_14.field_2 + 8),
                 (Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0xf4dccd,
                 (char (*) [12])&local_160,
                 (uint *)
                 "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
                 ,(char (*) [123])in_R9);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x362);
      std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
    }
  }
  if ((BitMask != 0) && (BitMask != Attribs->InstanceCount)) {
    FormatString<char[33],char[105]>
              ((string *)((long)&msg_15.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should."
               ,(char (*) [105])Attribs);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x366);
    std::__cxx11::string::~string((string *)(msg_15.field_2._M_local_buf + 8));
  }
  if (*(ulong *)(InstDataSize + 8) < Attribs->InstanceBufferOffset) {
    FormatString<char[33],char[23],unsigned_long,char[36],unsigned_long,char[3]>
              ((string *)((long)&msg_16.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])&Attribs->InstanceBufferOffset
               ,(unsigned_long *)") is greater than the buffer size (",
               (char (*) [36])(InstDataSize + 8),(unsigned_long *)0xf65ced,
               (char (*) [3])in_stack_fffffffffffffb80);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x369);
    std::__cxx11::string::~string((string *)(msg_16.field_2._M_local_buf + 8));
  }
  if (*(long *)(InstDataSize + 8) - Attribs->InstanceBufferOffset < _i) {
    msg_17.field_2._8_8_ = _i + Attribs->InstanceBufferOffset;
    FormatString<char[33],char[23],unsigned_long,char[26],unsigned_long,char[21]>
              ((string *)local_2a0,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer size (",(char (*) [23])(InstDataSize + 8),
               (unsigned_long *)") is too small: at least ",
               (char (*) [26])((long)&msg_17.field_2 + 8),(unsigned_long *)" bytes are required.",
               (char (*) [21])in_stack_fffffffffffffb80);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x36d);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  Args_1_00 = (char (*) [60])(ulong)*(uint *)(msg.field_2._8_8_ + 0x34);
  if (Attribs->InstanceBufferOffset % (ulong)Args_1_00 != 0) {
    FormatString<char[33],char[23],unsigned_long,char[22],unsigned_int,char[50]>
              ((string *)((long)&msg_18.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])&Attribs->InstanceBufferOffset
               ,(unsigned_long *)") must be aligned by ",(char (*) [22])(msg.field_2._8_8_ + 0x34),
               (uint *)" (RayTracingProperties::InstanceBufferAlignment).",in_stack_fffffffffffffb80
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    Args_1_00 = (char (*) [60])0x371;
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x371);
    std::__cxx11::string::~string((string *)(msg_18.field_2._M_local_buf + 8));
  }
  BVar5 = operator&(*(BIND_FLAGS *)(InstDataSize + 0x10),BIND_RAY_TRACING);
  if (BVar5 != BIND_RAY_TRACING) {
    FormatString<char[33],char[60]>
              ((string *)&ScratchDesc,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer was not created with BIND_RAY_TRACING flag.",
               Args_1_00);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x374);
    std::__cxx11::string::~string((string *)&ScratchDesc);
  }
  iVar4 = (*(Attribs->pScratchBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar9 = CONCAT44(extraout_var_02,iVar4);
  if (*(ulong *)(lVar9 + 8) < Attribs->ScratchBufferOffset) {
    FormatString<char[33],char[22],unsigned_long,char[36],unsigned_long,char[3]>
              ((string *)((long)&msg_20.field_2 + 8),(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])&Attribs->ScratchBufferOffset,
               (unsigned_long *)") is greater than the buffer size (",(char (*) [36])(lVar9 + 8),
               (unsigned_long *)0xf65ced,(char (*) [3])in_stack_fffffffffffffb80);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x379);
    std::__cxx11::string::~string((string *)(msg_20.field_2._M_local_buf + 8));
  }
  if (Attribs->ScratchBufferOffset % (ulong)*(uint *)(msg.field_2._8_8_ + 0x30) != 0) {
    FormatString<char[33],char[22],unsigned_long,char[22],unsigned_int,char[49]>
              ((string *)local_330,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])&Attribs->ScratchBufferOffset,
               (unsigned_long *)") must be aligned by ",(char (*) [22])(msg.field_2._8_8_ + 0x30),
               (uint *)" (RayTracingProperties::ScratchBufferAlignment).",
               (char (*) [49])in_stack_fffffffffffffb80);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x37d);
    std::__cxx11::string::~string((string *)local_330);
  }
  if ((Attribs->Update & 1U) == 0) {
    lVar1 = *(long *)(lVar9 + 8);
    UVar2 = Attribs->ScratchBufferOffset;
    iVar4 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[10])();
    Args_1_01 = (char (*) [121])CONCAT44(extraout_var_04,iVar4);
    if ((char (*) [121])(lVar1 - UVar2) < Args_1_01) {
      FormatString<char[33],char[120]>
                ((string *)((long)&msg_23.field_2 + 8),
                 (Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])
                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer."
                 ,(char (*) [120])Args_1_01);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      Args_1_01 = (char (*) [121])0x387;
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x387);
      std::__cxx11::string::~string((string *)(msg_23.field_2._M_local_buf + 8));
    }
  }
  else {
    lVar1 = *(long *)(lVar9 + 8);
    UVar2 = Attribs->ScratchBufferOffset;
    iVar4 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[10])();
    Args_1_01 = (char (*) [121])CONCAT44(extraout_var_03,iVar4);
    msg_21.field_2._8_8_ = Args_1_01;
    if (lVar1 - UVar2 < extraout_RDX) {
      FormatString<char[33],char[121]>
                ((string *)local_360,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])
                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer."
                 ,Args_1_01);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      Args_1_01 = (char (*) [121])0x382;
      DebugAssertionFailed
                (pCVar6,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x382);
      std::__cxx11::string::~string((string *)local_360);
    }
  }
  BVar5 = operator&(*(BIND_FLAGS *)(lVar9 + 0x10),BIND_RAY_TRACING);
  if (BVar5 != BIND_RAY_TRACING) {
    FormatString<char[33],char[59]>
              ((string *)local_3b0,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer was not created with BIND_RAY_TRACING flag.",
               (char (*) [59])Args_1_01);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x38b);
    std::__cxx11::string::~string((string *)local_3b0);
  }
  return true;
}

Assistant:

bool VerifyBuildTLASAttribs(const BuildTLASAttribs& Attribs, const RayTracingProperties& RTProps)
{
#define CHECK_BUILD_TLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Build TLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pTLAS != nullptr, "pTLAS must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pScratchBuffer != nullptr, "pScratchBuffer must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstances != nullptr, "pInstances must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstanceBuffer != nullptr, "pInstanceBuffer must not be null.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Attribs.HitGroupStride != 0,
                             "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");

    const TopLevelASDesc& TLASDesc = Attribs.pTLAS->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceCount <= TLASDesc.MaxInstanceCount,
                             "InstanceCount (", Attribs.InstanceCount, ") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
                             TLASDesc.MaxInstanceCount, ").");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS((TLASDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_UPDATE) == RAYTRACING_BUILD_AS_ALLOW_UPDATE,
                                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.");

        const Uint32 PrevInstanceCount = Attribs.pTLAS->GetBuildInfo().InstanceCount;
        CHECK_BUILD_TLAS_ATTRIBS(PrevInstanceCount == Attribs.InstanceCount,
                                 "Update is true, but InstanceCount (", Attribs.InstanceCount, ") does not match the previous value (", PrevInstanceCount, ").");
    }

    const BufferDesc& InstDesc          = Attribs.pInstanceBuffer->GetDesc();
    const size_t      InstDataSize      = size_t{Attribs.InstanceCount} * size_t{TLAS_INSTANCE_DATA_SIZE};
    Uint32            AutoOffsetCounter = 0;

    // Calculate instance data size
    for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
    {
        constexpr Uint32             BitMask = (1u << 24) - 1;
        const TLASBuildInstanceData& Inst    = Attribs.pInstances[i];

        VERIFY((Inst.CustomId & ~BitMask) == 0, "Only the lower 24 bits are used.");

        VERIFY(Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO ||
                   (Inst.ContributionToHitGroupIndex & ~BitMask) == 0,
               "Only the lower 24 bits are used.");

        CHECK_BUILD_TLAS_ATTRIBS(Inst.InstanceName != nullptr, "pInstances[", i, "].InstanceName must not be null.");
        CHECK_BUILD_TLAS_ATTRIBS(Inst.pBLAS != nullptr, "pInstances[", i, "].pBLAS must not be null.");

        if (Attribs.Update)
        {
            const TLASInstanceDesc IDesc = Attribs.pTLAS->GetInstanceDesc(Inst.InstanceName);
            CHECK_BUILD_TLAS_ATTRIBS(IDesc.InstanceIndex != INVALID_INDEX, "Update is true, but pInstances[", i, "].InstanceName does not exists.");
        }

        if (Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
            ++AutoOffsetCounter;

        CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO,
                                 "pInstances[", i,
                                 "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO "
                                 "if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");
    }

    CHECK_BUILD_TLAS_ATTRIBS(AutoOffsetCounter == 0 || AutoOffsetCounter == Attribs.InstanceCount,
                             "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset <= InstDesc.Size,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") is greater than the buffer size (", InstDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(InstDesc.Size - Attribs.InstanceBufferOffset >= InstDataSize,
                             "pInstanceBuffer size (", InstDesc.Size, ") is too small: at least ",
                             InstDataSize + Attribs.InstanceBufferOffset, " bytes are required.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset % RTProps.InstanceBufferAlignment == 0,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") must be aligned by ", RTProps.InstanceBufferAlignment,
                             " (RayTracingProperties::InstanceBufferAlignment).");

    CHECK_BUILD_TLAS_ATTRIBS((InstDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pInstanceBuffer was not created with BIND_RAY_TRACING flag.");

    const BufferDesc& ScratchDesc = Attribs.pScratchBuffer->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset <= ScratchDesc.Size,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") is greater than the buffer size (", ScratchDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset % RTProps.ScratchBufferAlignment == 0,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") must be aligned by ", RTProps.ScratchBufferAlignment,
                             " (RayTracingProperties::ScratchBufferAlignment).");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Update,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer.");
    }
    else
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Build,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer.");
    }

    CHECK_BUILD_TLAS_ATTRIBS((ScratchDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pScratchBuffer was not created with BIND_RAY_TRACING flag.");
#undef CHECK_BUILD_TLAS_ATTRIBS

    return true;
}